

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Mapping.c
# Opt level: O0

void AArch64_reg_access(cs_insn *insn,uint16_t *regs_read,uint8_t *regs_read_count,
                       uint16_t *regs_write,uint8_t *regs_write_count)

{
  long lVar1;
  long lVar2;
  _Bool _Var3;
  uint16_t *in_RCX;
  byte *in_RDX;
  uint16_t *in_RSI;
  long in_RDI;
  byte *in_R8;
  cs_arm64_op *op;
  cs_arm64 *arm64;
  uint8_t write_count;
  uint8_t read_count;
  uint8_t i;
  byte local_2b;
  byte local_2a;
  byte local_29;
  
  lVar2 = *(long *)(in_RDI + 0xf0);
  local_2a = *(byte *)(*(long *)(in_RDI + 0xf0) + 0x20);
  local_2b = *(byte *)(*(long *)(in_RDI + 0xf0) + 0x4a);
  memcpy(in_RSI,*(void **)(in_RDI + 0xf0),(ulong)local_2a << 1);
  memcpy(in_RCX,(void *)(*(long *)(in_RDI + 0xf0) + 0x22),(ulong)local_2b << 1);
  for (local_29 = 0; local_29 < *(byte *)(lVar2 + 0x5e); local_29 = local_29 + 1) {
    lVar1 = lVar2 + 0x60 + (ulong)local_29 * 0x38;
    if (*(int *)(lVar1 + 0x18) == 1) {
      if (((*(byte *)(lVar1 + 0x30) & 1) != 0) &&
         (_Var3 = arr_exist(in_RSI,local_2a,*(uint *)(lVar1 + 0x20)), !_Var3)) {
        in_RSI[local_2a] = (uint16_t)*(undefined4 *)(lVar1 + 0x20);
        local_2a = local_2a + 1;
      }
      if (((*(byte *)(lVar1 + 0x30) & 2) != 0) &&
         (_Var3 = arr_exist(in_RCX,local_2b,*(uint *)(lVar1 + 0x20)), !_Var3)) {
        in_RCX[local_2b] = (uint16_t)*(undefined4 *)(lVar1 + 0x20);
        local_2b = local_2b + 1;
      }
    }
    else if (*(int *)(lVar1 + 0x18) == 3) {
      if ((*(int *)(lVar1 + 0x20) != 0) &&
         (_Var3 = arr_exist(in_RSI,local_2a,*(uint *)(lVar1 + 0x20)), !_Var3)) {
        in_RSI[local_2a] = (uint16_t)*(undefined4 *)(lVar1 + 0x20);
        local_2a = local_2a + 1;
      }
      if ((*(int *)(lVar1 + 0x24) != 0) &&
         (_Var3 = arr_exist(in_RSI,local_2a,*(uint *)(lVar1 + 0x24)), !_Var3)) {
        in_RSI[local_2a] = (uint16_t)*(undefined4 *)(lVar1 + 0x24);
        local_2a = local_2a + 1;
      }
      if ((((*(byte *)(lVar2 + 0x5d) & 1) != 0) && (*(int *)(lVar1 + 0x20) != 0)) &&
         (_Var3 = arr_exist(in_RCX,local_2b,*(uint *)(lVar1 + 0x20)), !_Var3)) {
        in_RCX[local_2b] = (uint16_t)*(undefined4 *)(lVar1 + 0x20);
        local_2b = local_2b + 1;
      }
    }
  }
  *in_RDX = local_2a;
  *in_R8 = local_2b;
  return;
}

Assistant:

void AArch64_reg_access(const cs_insn *insn,
		cs_regs regs_read, uint8_t *regs_read_count,
		cs_regs regs_write, uint8_t *regs_write_count)
{
	uint8_t i;
	uint8_t read_count, write_count;
	cs_arm64 *arm64 = &(insn->detail->arm64);

	read_count = insn->detail->regs_read_count;
	write_count = insn->detail->regs_write_count;

	// implicit registers
	memcpy(regs_read, insn->detail->regs_read, read_count * sizeof(insn->detail->regs_read[0]));
	memcpy(regs_write, insn->detail->regs_write, write_count * sizeof(insn->detail->regs_write[0]));

	// explicit registers
	for (i = 0; i < arm64->op_count; i++) {
		cs_arm64_op *op = &(arm64->operands[i]);
		switch((int)op->type) {
			case ARM64_OP_REG:
				if ((op->access & CS_AC_READ) && !arr_exist(regs_read, read_count, op->reg)) {
					regs_read[read_count] = (uint16_t)op->reg;
					read_count++;
				}
				if ((op->access & CS_AC_WRITE) && !arr_exist(regs_write, write_count, op->reg)) {
					regs_write[write_count] = (uint16_t)op->reg;
					write_count++;
				}
				break;
			case ARM_OP_MEM:
				// registers appeared in memory references always being read
				if ((op->mem.base != ARM64_REG_INVALID) && !arr_exist(regs_read, read_count, op->mem.base)) {
					regs_read[read_count] = (uint16_t)op->mem.base;
					read_count++;
				}
				if ((op->mem.index != ARM64_REG_INVALID) && !arr_exist(regs_read, read_count, op->mem.index)) {
					regs_read[read_count] = (uint16_t)op->mem.index;
					read_count++;
				}
				if ((arm64->writeback) && (op->mem.base != ARM64_REG_INVALID) && !arr_exist(regs_write, write_count, op->mem.base)) {
					regs_write[write_count] = (uint16_t)op->mem.base;
					write_count++;
				}
			default:
				break;
		}
	}

	*regs_read_count = read_count;
	*regs_write_count = write_count;
}